

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

Block * __thiscall Js::CompoundString::BlockInfo::Resize(BlockInfo *this,Recycler *recycler)

{
  uint uVar1;
  WriteBarrierPtr<void> *address;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  char16_t *dst;
  Block *block;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x191,"(recycler)","recycler");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  CVar4 = AlignCharCapacityForAllocation(this->charLength);
  CVar4 = GrowCharCapacity(CVar4);
  bVar3 = ShouldAllocateBuffer(CVar4);
  if (bVar3) {
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_5f72374;
    data.filename._0_4_ = 0x196;
    data.plusSize = (ulong)CVar4;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    block = (Block *)0x0;
    dst = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                    ((Memory *)this_00,(Recycler *)Memory::Recycler::Alloc,0,(ulong)CVar4);
    this->charCapacity = CVar4;
    uVar1 = this->charLength;
    CVar4 = Block::PointerLengthFromCharLength(CVar4);
    Memory::Recycler::WBSetBitRange((char *)dst,CVar4);
    js_wmemcpy_s(dst,(ulong)this->charCapacity,(char16 *)(this->buffer).ptr,(ulong)uVar1);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->buffer,dst);
    address = (WriteBarrierPtr<void> *)(this->buffer).ptr;
    CVar4 = PointerLength(this);
    Memory::_ArrayWriteBarrier<Memory::_write_barrier_policy>::
    WriteBarrier<Memory::WriteBarrierPtr<void>>(address,(ulong)CVar4);
  }
  else {
    block = Block::New((this->buffer).ptr,this->charLength,true,recycler);
    CopyFrom(this,block);
  }
  return block;
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::Resize(Recycler *const recycler)
    {
        Assert(recycler);

        const CharCount newCharCapacity = GrowCharCapacity(AlignCharCapacityForAllocation(CharLength()));
        if(ShouldAllocateBuffer(newCharCapacity))
        {
            void *const newBuffer = RecyclerNewArray(recycler, char16, newCharCapacity);
            charCapacity = newCharCapacity;
            const CharCount charLength = CharLength();

            ArrayWriteBarrierVerifyBits(Block::Pointers(newBuffer), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s((char16*)newBuffer, charCapacity, (char16*)PointerValue(buffer), charLength);
            buffer = newBuffer;
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, CharLength(), true, recycler);
        CopyFrom(block);
        return block;
    }